

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,longdouble *__a,longdouble *__b,longdouble *__c)

{
  longdouble lVar1;
  longdouble lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  longdouble lVar16;
  longdouble lVar17;
  item __tmp;
  
  lVar1 = *__b;
  lVar16 = (longdouble)*(int *)(__a + 2);
  lVar17 = *__a / lVar16;
  lVar2 = *__c;
  if (lVar17 <= lVar1 / lVar16) {
    if (lVar2 / lVar16 < lVar17) goto LAB_00506228;
    if (lVar2 / (longdouble)*(int *)(__b + 2) < lVar1 / (longdouble)*(int *)(__b + 2))
    goto LAB_0050627f;
  }
  else if (lVar1 / (longdouble)*(int *)(__b + 2) <= lVar2 / (longdouble)*(int *)(__b + 2)) {
    if (lVar2 / lVar16 < lVar17) {
LAB_0050627f:
      uVar3 = *__result;
      uVar4 = __result[1];
      uVar5 = __result[2];
      uVar6 = __result[3];
      uVar7 = __result[4];
      uVar8 = __result[5];
      uVar9 = *(undefined8 *)__c;
      uVar10 = *(undefined8 *)((long)__c + 8);
      uVar11 = *(undefined8 *)(__c + 1);
      uVar12 = *(undefined8 *)((long)__c + 0x18);
      uVar13 = *(undefined8 *)((long)__c + 0x18);
      uVar14 = *(undefined8 *)(__c + 2);
      uVar15 = *(undefined8 *)((long)__c + 0x28);
      __result[2] = *(undefined8 *)(__c + 1);
      __result[3] = uVar13;
      __result[4] = uVar14;
      __result[5] = uVar15;
      *__result = uVar9;
      __result[1] = uVar10;
      __result[2] = uVar11;
      __result[3] = uVar12;
      *(undefined8 *)(__c + 1) = uVar5;
      *(undefined8 *)((long)__c + 0x18) = uVar6;
      *(undefined8 *)(__c + 2) = uVar7;
      *(undefined8 *)((long)__c + 0x28) = uVar8;
      *(undefined8 *)__c = uVar3;
      *(undefined8 *)((long)__c + 8) = uVar4;
      *(undefined8 *)(__c + 1) = uVar5;
      *(undefined8 *)((long)__c + 0x18) = uVar6;
      return;
    }
LAB_00506228:
    uVar3 = *__result;
    uVar4 = __result[1];
    uVar5 = __result[2];
    uVar6 = __result[3];
    uVar7 = __result[4];
    uVar8 = __result[5];
    uVar9 = *(undefined8 *)__a;
    uVar10 = *(undefined8 *)((long)__a + 8);
    uVar11 = *(undefined8 *)(__a + 1);
    uVar12 = *(undefined8 *)((long)__a + 0x18);
    uVar13 = *(undefined8 *)((long)__a + 0x18);
    uVar14 = *(undefined8 *)(__a + 2);
    uVar15 = *(undefined8 *)((long)__a + 0x28);
    __result[2] = *(undefined8 *)(__a + 1);
    __result[3] = uVar13;
    __result[4] = uVar14;
    __result[5] = uVar15;
    *__result = uVar9;
    __result[1] = uVar10;
    __result[2] = uVar11;
    __result[3] = uVar12;
    *(undefined8 *)(__a + 1) = uVar5;
    *(undefined8 *)((long)__a + 0x18) = uVar6;
    *(undefined8 *)(__a + 2) = uVar7;
    *(undefined8 *)((long)__a + 0x28) = uVar8;
    *(undefined8 *)__a = uVar3;
    *(undefined8 *)((long)__a + 8) = uVar4;
    *(undefined8 *)(__a + 1) = uVar5;
    *(undefined8 *)((long)__a + 0x18) = uVar6;
    return;
  }
  uVar3 = *__result;
  uVar4 = __result[1];
  uVar5 = __result[2];
  uVar6 = __result[3];
  uVar7 = __result[4];
  uVar8 = __result[5];
  uVar9 = *(undefined8 *)__b;
  uVar10 = *(undefined8 *)((long)__b + 8);
  uVar11 = *(undefined8 *)(__b + 1);
  uVar12 = *(undefined8 *)((long)__b + 0x18);
  uVar13 = *(undefined8 *)((long)__b + 0x18);
  uVar14 = *(undefined8 *)(__b + 2);
  uVar15 = *(undefined8 *)((long)__b + 0x28);
  __result[2] = *(undefined8 *)(__b + 1);
  __result[3] = uVar13;
  __result[4] = uVar14;
  __result[5] = uVar15;
  *__result = uVar9;
  __result[1] = uVar10;
  __result[2] = uVar11;
  __result[3] = uVar12;
  *(undefined8 *)(__b + 1) = uVar5;
  *(undefined8 *)((long)__b + 0x18) = uVar6;
  *(undefined8 *)(__b + 2) = uVar7;
  *(undefined8 *)((long)__b + 0x28) = uVar8;
  *(undefined8 *)__b = uVar3;
  *(undefined8 *)((long)__b + 8) = uVar4;
  *(undefined8 *)(__b + 1) = uVar5;
  *(undefined8 *)((long)__b + 0x18) = uVar6;
  return;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }